

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

string * __thiscall helics::helicsVectorString_abi_cxx11_(double *vals,size_t size)

{
  string_view sep;
  basic_string_view<char> *this;
  long in_RDX;
  char *in_RSI;
  string *in_RDI;
  undefined1 in_stack_00000170 [16];
  undefined1 in_stack_00000180 [16];
  string *psVar1;
  size_t in_stack_ffffffffffffff30;
  undefined1 local_c0 [32];
  char *local_a0;
  undefined8 local_98;
  value<fmt::v11::context> local_78;
  undefined8 local_60;
  value<fmt::v11::context> *local_58;
  char *local_50;
  undefined8 local_48;
  undefined1 *local_40;
  char *local_38;
  undefined8 local_30;
  value<fmt::v11::context> *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  value<fmt::v11::context> *local_8;
  
  local_a0 = "[{}]";
  local_98 = 4;
  this = (basic_string_view<char> *)(in_RSI + in_RDX * 8);
  psVar1 = in_RDI;
  ::fmt::v11::basic_string_view<char>::basic_string_view(this,in_RSI);
  sep.size_ = in_stack_ffffffffffffff30;
  sep.data_ = (char *)psVar1;
  ::fmt::v11::join<double_const*,double_const*>((double *)in_RDI,(double *)this,sep);
  local_38 = local_a0;
  local_30 = local_98;
  local_40 = local_c0;
  local_50 = local_a0;
  local_48 = local_98;
  local_8 = &local_78;
  local_10 = local_40;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<fmt::v11::join_view<const_double_*,_const_double_*,_char>,_0>(local_8,local_40);
  local_18 = &local_60;
  local_20 = &local_78;
  local_60 = 0xf;
  local_58 = local_20;
  ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000180,(format_args)in_stack_00000170);
  return psVar1;
}

Assistant:

std::string helicsVectorString(const double* vals, size_t size)
{
    return fmt::format("[{}]", fmt::join(vals, vals + size, ","));
}